

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall QComboBox::hidePopup(QComboBox *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QComboBoxPrivate *pQVar4;
  QComboBoxPrivateContainer *pQVar5;
  QAbstractItemView *pQVar6;
  QStyle *pQVar7;
  ulong uVar8;
  ContextType *in_RDI;
  long in_FS_OFFSET;
  QItemSelectionModel *selectionModel;
  QComboBoxPrivate *d;
  QItemSelection selection;
  QScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_widgets_widgets_qcombobox_cpp:2906:41)>
  resetHidingPopup;
  QWidget *in_stack_ffffffffffffff68;
  QComboBoxPrivate *in_stack_ffffffffffffff70;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QComboBox *)0x53b910);
  if (((byte)pQVar4->field_0x34c >> 4 & 1) != 0) goto LAB_0053bb1e;
  pQVar4->field_0x34c = pQVar4->field_0x34c & 0xef | 0x10;
  qScopeGuard<QComboBox::hidePopup()::__1>
            ((anon_class_8_1_54a39804_for_m_func *)in_stack_ffffffffffffff68);
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QComboBoxPrivateContainer> *)0x53b990);
  if (bVar2) {
    QPointer<QComboBoxPrivateContainer>::operator->((QPointer<QComboBoxPrivateContainer> *)0x53b9a7)
    ;
    bVar2 = QWidget::isVisible((QWidget *)0x53b9af);
    if (bVar2) {
      pQVar5 = QPointer<QComboBoxPrivateContainer>::operator->
                         ((QPointer<QComboBoxPrivateContainer> *)0x53b9d1);
      pQVar6 = QComboBoxPrivateContainer::itemView(pQVar5);
      if (pQVar6 == (QAbstractItemView *)0x0) {
        in_stack_ffffffffffffff70 = (QComboBoxPrivate *)0x0;
      }
      else {
        pQVar5 = QPointer<QComboBoxPrivateContainer>::operator->
                           ((QPointer<QComboBoxPrivateContainer> *)0x53b9f0);
        QComboBoxPrivateContainer::itemView(pQVar5);
        in_stack_ffffffffffffff70 =
             (QComboBoxPrivate *)
             QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_ffffffffffffff70);
      }
      pQVar4 = in_stack_ffffffffffffff70;
      pQVar7 = QWidget::style(in_stack_ffffffffffffff68);
      iVar3 = (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,0x51,0,in_RDI);
      if ((iVar3 != 0) && (pQVar4 != (QComboBoxPrivate *)0x0)) {
        uVar8 = QItemSelectionModel::hasSelection();
        iVar3 = (int)((ulong)pQVar4 >> 0x20);
        if ((uVar8 & 1) != 0) {
          QItemSelectionModel::selection();
          pQVar5 = ::QPointer::operator_cast_to_QComboBoxPrivateContainer_
                             ((QPointer<QComboBoxPrivateContainer> *)0x53baae);
          QItemSelection::QItemSelection
                    ((QItemSelection *)in_stack_ffffffffffffff70,(QItemSelection *)pQVar5);
          QTimer::singleShot<int,QComboBox::hidePopup()::__0>
                    (iVar3,in_RDI,(anon_class_40_3_82f6aaad_for_o *)in_stack_ffffffffffffff70);
          hidePopup()::$_0::~__0((anon_class_40_3_82f6aaad_for_o *)0x53baf3);
          QItemSelection::~QItemSelection((QItemSelection *)0x53bafd);
          goto LAB_0053bb11;
        }
      }
      QComboBoxPrivate::doHidePopup(in_stack_ffffffffffffff70);
    }
  }
LAB_0053bb11:
  QScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qcombobox.cpp:2906:41)>
  ::~QScopeGuard((QScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_widgets_widgets_qcombobox_cpp:2906:41)>
                  *)in_stack_ffffffffffffff70);
LAB_0053bb1e:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QComboBox::hidePopup()
{
    Q_D(QComboBox);
    if (d->hidingPopup)
        return;
    d->hidingPopup = true;
    // can't use QScopedValueRollback on a bitfield
    auto resetHidingPopup = qScopeGuard([d]{
        d->hidingPopup = false;
    });

    if (!d->container || !d->container->isVisible())
        return;

#if QT_CONFIG(effects)
    QItemSelectionModel *selectionModel = d->container->itemView()
                                        ? d->container->itemView()->selectionModel() : nullptr;
    // Flash selected/triggered item (if any) before hiding the popup.
    if (style()->styleHint(QStyle::SH_Menu_FlashTriggeredItem, nullptr, this) &&
        selectionModel && selectionModel->hasSelection()) {
        const QItemSelection selection = selectionModel->selection();

        QTimer::singleShot(0, d->container, [d, selection, selectionModel]{
            QSignalBlocker modelBlocker(d->model);
            QSignalBlocker viewBlocker(d->container->itemView());
            QSignalBlocker containerBlocker(d->container);

            // Deselect item and wait 60 ms.
            selectionModel->select(selection, QItemSelectionModel::Toggle);
            QTimer::singleShot(60, d->container, [d, selection, selectionModel]{
                QSignalBlocker modelBlocker(d->model);
                QSignalBlocker viewBlocker(d->container->itemView());
                QSignalBlocker containerBlocker(d->container);
                selectionModel->select(selection, QItemSelectionModel::Toggle);
                QTimer::singleShot(20, d->container, [d] {
                    d->doHidePopup();
                });
            });
        });
    } else
#endif // QT_CONFIG(effects)
    {
        d->doHidePopup();
    }
}